

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::scrollContentsBy(QTextEdit *this,int dx,int dy)

{
  QFlags_conflict1 *pQVar1;
  QTextEditPrivate *d;
  
  d_func((QTextEdit *)0x6d4464);
  QWidget::isRightToLeft((QWidget *)0x6d4473);
  QWidget::scroll((QWidget *)CONCAT44(dx,dy),d._4_4_,(int)d);
  pQVar1 = (QFlags_conflict1 *)QGuiApplication::inputMethod();
  Qt::operator|((enum_type)((ulong)pQVar1 >> 0x20),(enum_type)pQVar1);
  QInputMethod::update(pQVar1);
  return;
}

Assistant:

void QTextEdit::scrollContentsBy(int dx, int dy)
{
    Q_D(QTextEdit);
    if (isRightToLeft())
        dx = -dx;
    d->viewport->scroll(dx, dy);
    QGuiApplication::inputMethod()->update(Qt::ImCursorRectangle | Qt::ImAnchorRectangle);
}